

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrInv.c
# Opt level: O0

Vec_Int_t * Pdr_ManCountFlops(Pdr_Man_t *p,Vec_Ptr_t *vCubes)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *p_00;
  void *pvVar3;
  int local_30;
  int local_2c;
  int n;
  int i;
  Pdr_Set_t *pCube;
  Vec_Int_t *vFlopCount;
  Vec_Ptr_t *vCubes_local;
  Pdr_Man_t *p_local;
  
  iVar1 = Aig_ManRegNum(p->pAig);
  p_00 = Vec_IntStart(iVar1);
  local_2c = 0;
  do {
    iVar1 = Vec_PtrSize(vCubes);
    if (iVar1 <= local_2c) {
      return p_00;
    }
    pvVar3 = Vec_PtrEntry(vCubes,local_2c);
    if (*(int *)((long)pvVar3 + 8) != -1) {
      for (local_30 = 0; local_30 < *(int *)((long)pvVar3 + 0x10); local_30 = local_30 + 1) {
        if ((*(int *)((long)pvVar3 + (long)local_30 * 4 + 0x14) < 0) ||
           (iVar1 = *(int *)((long)pvVar3 + (long)local_30 * 4 + 0x14),
           iVar2 = Aig_ManRegNum(p->pAig), SBORROW4(iVar1,iVar2 * 2) == iVar1 + iVar2 * -2 < 0)) {
          __assert_fail("pCube->Lits[n] >= 0 && pCube->Lits[n] < 2*Aig_ManRegNum(p->pAig)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/pdr/pdrInv.c"
                        ,0x82,"Vec_Int_t *Pdr_ManCountFlops(Pdr_Man_t *, Vec_Ptr_t *)");
        }
        Vec_IntAddToEntry(p_00,*(int *)((long)pvVar3 + (long)local_30 * 4 + 0x14) >> 1,1);
      }
    }
    local_2c = local_2c + 1;
  } while( true );
}

Assistant:

Vec_Int_t * Pdr_ManCountFlops( Pdr_Man_t * p, Vec_Ptr_t * vCubes )
{
    Vec_Int_t * vFlopCount;
    Pdr_Set_t * pCube;
    int i, n;
    vFlopCount = Vec_IntStart( Aig_ManRegNum(p->pAig) );
    Vec_PtrForEachEntry( Pdr_Set_t *, vCubes, pCube, i )
    {
        if ( pCube->nRefs == -1 )
            continue;
        for ( n = 0; n < pCube->nLits; n++ )
        {
            assert( pCube->Lits[n] >= 0 && pCube->Lits[n] < 2*Aig_ManRegNum(p->pAig) );
            Vec_IntAddToEntry( vFlopCount, pCube->Lits[n] >> 1, 1 );
        }
    }
    return vFlopCount;
}